

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutations.h
# Opt level: O0

void wasm::setIdentity(vector<unsigned_int,_std::allocator<unsigned_int>_> *ret)

{
  size_type sVar1;
  reference pvVar2;
  uint local_1c;
  Index i;
  size_type num;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(ret);
  if (sVar1 != 0) {
    for (local_1c = 0; local_1c < sVar1; local_1c = local_1c + 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (ret,(ulong)local_1c);
      *pvVar2 = local_1c;
    }
    return;
  }
  __assert_fail("num > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/permutations.h"
                ,0x25,"void wasm::setIdentity(std::vector<Index> &)");
}

Assistant:

inline void setIdentity(std::vector<Index>& ret) {
  auto num = ret.size();
  assert(num > 0); // must already be of the right size
  for (Index i = 0; i < num; i++) {
    ret[i] = i;
  }
}